

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O3

void __thiscall format::missing_arg_error::~missing_arg_error(missing_arg_error *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR__missing_arg_error_00160698;
  pcVar2 = (this->arg_)._M_dataplus._M_p;
  paVar1 = &(this->arg_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  operator_delete(this,0x30);
  return;
}

Assistant:

missing_arg_error (std::string arg, std::string msg="Argument missing")
   : std::runtime_error(msg)
   {
    arg_ = arg;
   }